

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O0

void __thiscall
cppjieba::DictTrie::Init
          (DictTrie *this,string *dict_path,string *user_dict_paths,
          UserWordWeightOption user_word_weight_opt)

{
  long lVar1;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *in_RDX;
  DictTrie *in_RSI;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *in_RDI;
  pointer pDVar2;
  DictTrie *unaff_retaddr;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *in_stack_00000038;
  DictTrie *in_stack_00000040;
  UserWordWeightOption in_stack_000001bc;
  DictTrie *in_stack_000001c0;
  string *in_stack_00000438;
  DictTrie *in_stack_00000440;
  string *in_stack_00000668;
  DictTrie *in_stack_00000670;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *node_infos;
  
  node_infos = in_RDI;
  LoadDict(in_stack_00000670,in_stack_00000668);
  pDVar2 = (pointer)CalcFreqSum(in_RSI,in_RDX);
  in_RDI[4].super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pDVar2;
  CalculateWeight(unaff_retaddr,node_infos,(double)in_RSI);
  SetStaticWordWeights(in_stack_000001c0,in_stack_000001bc);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    LoadUserDict(in_stack_00000440,in_stack_00000438);
  }
  Shrink(this,(vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)dict_path);
  CreateTrie(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

void Init(const string& dict_path, const string& user_dict_paths, UserWordWeightOption user_word_weight_opt) {
    LoadDict(dict_path);
    freq_sum_ = CalcFreqSum(static_node_infos_);
    CalculateWeight(static_node_infos_, freq_sum_);
    SetStaticWordWeights(user_word_weight_opt);

    if (user_dict_paths.size()) {
      LoadUserDict(user_dict_paths);
    }
    Shrink(static_node_infos_);
    CreateTrie(static_node_infos_);
  }